

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O3

void __thiscall
cmGlobalUnixMakefileGenerator3::WriteConvenienceRules2
          (cmGlobalUnixMakefileGenerator3 *this,ostream *ruleFileStream,
          cmLocalUnixMakefileGenerator3 *lg)

{
  cmOutputConverter *this_00;
  pointer pcVar1;
  long *plVar2;
  pointer puVar3;
  cmState *this_01;
  pointer pbVar4;
  pointer pbVar5;
  bool bVar6;
  bool bVar7;
  TargetType TVar8;
  string *psVar9;
  ostream *poVar10;
  mapped_type *pmVar11;
  size_t sVar12;
  pointer ppcVar13;
  pointer pbVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  char *pcVar16;
  pointer puVar17;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  cmGeneratorTarget *gtarget;
  cmGlobalUnixMakefileGenerator3 *local_308;
  string localName;
  string local_2e0;
  string tmp;
  string makeTargetName;
  string makefileName;
  string name;
  EchoProgress progress;
  ostringstream progressArg;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8 [6];
  ios_base local_178 [264];
  string *local_70;
  ProgressMapType *local_68;
  pointer local_60;
  pointer local_58;
  string local_50;
  
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  localName._M_dataplus._M_p = (pointer)&localName.field_2;
  localName._M_string_length = 0;
  localName.field_2._M_local_buf[0] = '\0';
  makeTargetName._M_dataplus._M_p = (pointer)&makeTargetName.field_2;
  makeTargetName._M_string_length = 0;
  makeTargetName.field_2._M_local_buf[0] = '\0';
  local_308 = this;
  WriteDirectoryRules2(this,ruleFileStream,lg);
  _progressArg = (pointer)local_1d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&progressArg,"CMAKE_SUPPRESS_REGENERATION","");
  bVar6 = cmGlobalGenerator::GlobalSettingIsOn
                    ((cmGlobalGenerator *)local_308,(string *)&progressArg);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_progressArg != local_1d8) {
    operator_delete(_progressArg,local_1d8[0]._M_allocated_capacity + 1);
  }
  if (!bVar6) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[25]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&depends,
               (char (*) [25])"cmake_check_build_system");
  }
  ppcVar13 = (lg->super_cmLocalCommonGenerator).super_cmLocalGenerator.GeneratorTargets.
             super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_60 = (lg->super_cmLocalCommonGenerator).super_cmLocalGenerator.GeneratorTargets.
             super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (ppcVar13 != local_60) {
    local_68 = &local_308->ProgressMap;
    this_00 = &(lg->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
    local_70 = &(lg->super_cmLocalCommonGenerator).ConfigName;
    do {
      gtarget = *ppcVar13;
      local_58 = ppcVar13;
      TVar8 = cmGeneratorTarget::GetType(gtarget);
      psVar9 = cmGeneratorTarget::GetName_abi_cxx11_(gtarget);
      name._M_dataplus._M_p = (pointer)&name.field_2;
      pcVar1 = (psVar9->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&name,pcVar1,pcVar1 + psVar9->_M_string_length);
      if ((TVar8 < GLOBAL_TARGET) && (name._M_string_length != 0)) {
        makefileName._M_dataplus._M_p = (pointer)&makefileName.field_2;
        makefileName._M_string_length = 0;
        makefileName.field_2._M_local_buf[0] = '\0';
        cmLocalUnixMakefileGenerator3::GetRelativeTargetDirectory_abi_cxx11_
                  ((string *)&progressArg,lg,gtarget);
        std::__cxx11::string::operator=((string *)&localName,(string *)&progressArg);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_progressArg != local_1d8) {
          operator_delete(_progressArg,local_1d8[0]._M_allocated_capacity + 1);
        }
        std::__cxx11::string::_M_assign((string *)&makefileName);
        std::__cxx11::string::append((char *)&makefileName);
        cmLocalUnixMakefileGenerator3::WriteDivider(lg,ruleFileStream);
        std::__ostream_insert<char,std::char_traits<char>>
                  (ruleFileStream,"# Target rules for target ",0x1a);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            (ruleFileStream,localName._M_dataplus._M_p,localName._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n\n",2);
        pbVar5 = commands.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pbVar4 = commands.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (commands.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            commands.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          paVar15 = &(commands.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->field_2;
          do {
            plVar2 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (paVar15 + -1))->_M_dataplus)._M_p;
            if (paVar15 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)plVar2) {
              operator_delete(plVar2,paVar15->_M_allocated_capacity + 1);
            }
            pbVar14 = (pointer)(paVar15 + 1);
            paVar15 = paVar15 + 2;
          } while (pbVar14 != pbVar5);
          commands.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = pbVar4;
        }
        std::__cxx11::string::_M_assign((string *)&makeTargetName);
        std::__cxx11::string::append((char *)&makeTargetName);
        cmLocalUnixMakefileGenerator3::GetRecursiveMakeCall
                  ((string *)&progressArg,lg,&makefileName,&makeTargetName);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands,
                   (string *)&progressArg);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_progressArg != local_1d8) {
          operator_delete(_progressArg,local_1d8[0]._M_allocated_capacity + 1);
        }
        std::__cxx11::string::_M_assign((string *)&makeTargetName);
        std::__cxx11::string::append((char *)&makeTargetName);
        cmLocalUnixMakefileGenerator3::GetRecursiveMakeCall
                  ((string *)&progressArg,lg,&makefileName,&makeTargetName);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands,
                   (string *)&progressArg);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_progressArg != local_1d8) {
          operator_delete(_progressArg,local_1d8[0]._M_allocated_capacity + 1);
        }
        std::__cxx11::string::append((char *)&localName);
        pbVar5 = depends.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pbVar4 = depends.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (depends.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            depends.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          paVar15 = &(depends.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->field_2;
          do {
            plVar2 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (paVar15 + -1))->_M_dataplus)._M_p;
            if (paVar15 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)plVar2) {
              operator_delete(plVar2,paVar15->_M_allocated_capacity + 1);
            }
            pbVar14 = (pointer)(paVar15 + 1);
            paVar15 = paVar15 + 2;
          } while (pbVar14 != pbVar5);
          depends.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = pbVar4;
        }
        progress.Dir._M_dataplus._M_p = (pointer)&progress.Dir.field_2;
        progress.Dir._M_string_length = 0;
        progress.Dir.field_2._M_local_buf[0] = '\0';
        progress.Arg._M_dataplus._M_p = (pointer)&progress.Arg.field_2;
        progress.Arg._M_string_length = 0;
        progress.Arg.field_2._M_local_buf[0] = '\0';
        cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)lg);
        std::__cxx11::string::_M_assign((string *)&progress);
        std::__cxx11::string::append((char *)&progress);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&progressArg);
        pmVar11 = std::
                  map<const_cmGeneratorTarget_*,_cmGlobalUnixMakefileGenerator3::TargetProgress,_cmGeneratorTarget::StrictTargetComparison,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmGlobalUnixMakefileGenerator3::TargetProgress>_>_>
                  ::operator[](local_68,&gtarget);
        puVar17 = (pmVar11->Marks).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        puVar3 = (pmVar11->Marks).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        if (puVar17 != puVar3) {
          pcVar16 = "";
          do {
            sVar12 = strlen(pcVar16);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&progressArg,pcVar16,sVar12);
            std::ostream::_M_insert<unsigned_long>((ulong)&progressArg);
            puVar17 = puVar17 + 1;
            pcVar16 = ",";
          } while (puVar17 != puVar3);
        }
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::operator=((string *)&progress.Arg,(string *)&tmp);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)tmp._M_dataplus._M_p != &tmp.field_2) {
          operator_delete(tmp._M_dataplus._M_p,tmp.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&progressArg);
        std::ios_base::~ios_base(local_178);
        this_01 = ((local_308->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance)
                  ->State;
        _progressArg = (pointer)local_1d8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&progressArg,"TARGET_MESSAGES","")
        ;
        pcVar16 = cmState::GetGlobalProperty(this_01,(string *)&progressArg);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_progressArg != local_1d8) {
          operator_delete(_progressArg,local_1d8[0]._M_allocated_capacity + 1);
        }
        if (pcVar16 == (char *)0x0) {
LAB_0032b301:
          std::operator+((string *)&progressArg,"Built target ",&name);
          cmLocalUnixMakefileGenerator3::AppendEcho
                    (lg,&commands,(string *)&progressArg,EchoNormal,&progress);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_progressArg != local_1d8) {
            operator_delete(_progressArg,local_1d8[0]._M_allocated_capacity + 1);
          }
        }
        else {
          bVar7 = cmSystemTools::IsOn(pcVar16);
          if (bVar7) goto LAB_0032b301;
        }
        AppendGlobalTargetDepends(local_308,&depends,gtarget);
        cmLocalUnixMakefileGenerator3::WriteMakeRule
                  (lg,ruleFileStream,"All Build rule for target.",&localName,&depends,&commands,true
                   ,false);
        bVar7 = cmGlobalGenerator::IsExcluded((cmGlobalGenerator *)local_308,gtarget);
        pbVar5 = depends.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pbVar4 = depends.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (!bVar7) {
          if (depends.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              depends.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            paVar15 = &(depends.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->field_2;
            do {
              plVar2 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(paVar15 + -1))->_M_dataplus)._M_p;
              if (paVar15 !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)plVar2) {
                operator_delete(plVar2,paVar15->_M_allocated_capacity + 1);
              }
              pbVar14 = (pointer)(paVar15 + 1);
              paVar15 = paVar15 + 2;
            } while (pbVar14 != pbVar5);
            depends.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = pbVar4;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&depends,&localName);
          pbVar5 = commands.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pbVar4 = commands.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (commands.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              commands.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            paVar15 = &(commands.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->field_2;
            do {
              plVar2 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(paVar15 + -1))->_M_dataplus)._M_p;
              if (paVar15 !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)plVar2) {
                operator_delete(plVar2,paVar15->_M_allocated_capacity + 1);
              }
              pbVar14 = (pointer)(paVar15 + 1);
              paVar15 = paVar15 + 2;
            } while (pbVar14 != pbVar5);
            commands.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = pbVar4;
          }
          _progressArg = (pointer)local_1d8;
          std::__cxx11::string::_M_construct<char_const*>((string *)&progressArg,"all","");
          cmLocalUnixMakefileGenerator3::WriteMakeRule
                    (lg,ruleFileStream,"Include target in all.",(string *)&progressArg,&depends,
                     &commands,true,false);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_progressArg != local_1d8) {
            operator_delete(_progressArg,local_1d8[0]._M_allocated_capacity + 1);
          }
        }
        pbVar5 = commands.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pbVar4 = commands.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (commands.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            commands.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          paVar15 = &(commands.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->field_2;
          do {
            plVar2 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (paVar15 + -1))->_M_dataplus)._M_p;
            if (paVar15 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)plVar2) {
              operator_delete(plVar2,paVar15->_M_allocated_capacity + 1);
            }
            pbVar14 = (pointer)(paVar15 + 1);
            paVar15 = paVar15 + 2;
          } while (pbVar14 != pbVar5);
          commands.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = pbVar4;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&progressArg);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&progressArg,"$(CMAKE_COMMAND) -E cmake_progress_start ",0x29);
        cmsys::SystemTools::CollapseFullPath(&local_2e0,&progress.Dir);
        cmOutputConverter::ConvertToOutputFormat(&tmp,this_00,&local_2e0,SHELL);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&progressArg,tmp._M_dataplus._M_p,
                   CONCAT44(tmp._M_string_length._4_4_,(undefined4)tmp._M_string_length));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)tmp._M_dataplus._M_p != &tmp.field_2) {
          operator_delete(tmp._M_dataplus._M_p,tmp.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
          operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
        }
        tmp._M_string_length._0_4_ = 0;
        tmp.field_2._M_allocated_capacity = 0;
        tmp.field_2._8_8_ = &tmp._M_string_length;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&progressArg," ",1);
        CountProgressMarksInTarget
                  (local_308,gtarget,
                   (set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                    *)&tmp);
        std::ostream::_M_insert<unsigned_long>((ulong)&progressArg);
        std::__cxx11::stringbuf::str();
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands,
                   &local_2e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
          operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
        }
        std::
        _Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
        ::~_Rb_tree((_Rb_tree<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::_Identity<const_cmGeneratorTarget_*>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                     *)&tmp);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&progressArg);
        std::ios_base::~ios_base(local_178);
        tmp._M_dataplus._M_p = (pointer)&tmp.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&tmp,"CMakeFiles/","");
        std::__cxx11::string::append((char *)&tmp);
        cmLocalUnixMakefileGenerator3::GetRecursiveMakeCall
                  ((string *)&progressArg,lg,&tmp,&localName);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands,
                   (string *)&progressArg);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_progressArg != local_1d8) {
          operator_delete(_progressArg,local_1d8[0]._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&progressArg);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&progressArg,"$(CMAKE_COMMAND) -E cmake_progress_start ",0x29);
        cmsys::SystemTools::CollapseFullPath(&local_50,&progress.Dir);
        cmOutputConverter::ConvertToOutputFormat(&local_2e0,this_00,&local_50,SHELL);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&progressArg,local_2e0._M_dataplus._M_p,local_2e0._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
          operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&progressArg," 0",2);
        std::__cxx11::stringbuf::str();
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands,
                   &local_2e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
          operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&progressArg);
        std::ios_base::~ios_base(local_178);
        pbVar5 = depends.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pbVar4 = depends.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (depends.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            depends.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          paVar15 = &(depends.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->field_2;
          do {
            plVar2 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (paVar15 + -1))->_M_dataplus)._M_p;
            if (paVar15 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)plVar2) {
              operator_delete(plVar2,paVar15->_M_allocated_capacity + 1);
            }
            pbVar14 = (pointer)(paVar15 + 1);
            paVar15 = paVar15 + 2;
          } while (pbVar14 != pbVar5);
          depends.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = pbVar4;
        }
        if (!bVar6) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[25]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&depends,
                     (char (*) [25])"cmake_check_build_system");
        }
        cmLocalUnixMakefileGenerator3::GetRelativeTargetDirectory_abi_cxx11_
                  ((string *)&progressArg,lg,gtarget);
        std::__cxx11::string::operator=((string *)&localName,(string *)&progressArg);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_progressArg != local_1d8) {
          operator_delete(_progressArg,local_1d8[0]._M_allocated_capacity + 1);
        }
        std::__cxx11::string::append((char *)&localName);
        cmLocalUnixMakefileGenerator3::WriteMakeRule
                  (lg,ruleFileStream,"Build rule for subdir invocation for target.",&localName,
                   &depends,&commands,true,false);
        pbVar5 = commands.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pbVar4 = commands.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (commands.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            commands.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          paVar15 = &(commands.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->field_2;
          do {
            plVar2 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (paVar15 + -1))->_M_dataplus)._M_p;
            if (paVar15 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)plVar2) {
              operator_delete(plVar2,paVar15->_M_allocated_capacity + 1);
            }
            pbVar14 = (pointer)(paVar15 + 1);
            paVar15 = paVar15 + 2;
          } while (pbVar14 != pbVar5);
          commands.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = pbVar4;
        }
        pbVar5 = depends.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pbVar4 = depends.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (depends.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            depends.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          paVar15 = &(depends.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->field_2;
          do {
            plVar2 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (paVar15 + -1))->_M_dataplus)._M_p;
            if (paVar15 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)plVar2) {
              operator_delete(plVar2,paVar15->_M_allocated_capacity + 1);
            }
            pbVar14 = (pointer)(paVar15 + 1);
            paVar15 = paVar15 + 2;
          } while (pbVar14 != pbVar5);
          depends.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = pbVar4;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&depends,&localName);
        cmLocalUnixMakefileGenerator3::WriteMakeRule
                  (lg,ruleFileStream,"Convenience name for target.",&name,&depends,&commands,true,
                   false);
        bVar7 = cmGeneratorTarget::NeedRelinkBeforeInstall(gtarget,local_70);
        if (bVar7) {
          cmLocalUnixMakefileGenerator3::GetRelativeTargetDirectory_abi_cxx11_
                    ((string *)&progressArg,lg,gtarget);
          std::__cxx11::string::operator=((string *)&localName,(string *)&progressArg);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_progressArg != local_1d8) {
            operator_delete(_progressArg,local_1d8[0]._M_allocated_capacity + 1);
          }
          std::__cxx11::string::append((char *)&localName);
          pbVar5 = depends.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pbVar4 = depends.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (depends.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              depends.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            paVar15 = &(depends.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->field_2;
            do {
              plVar2 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(paVar15 + -1))->_M_dataplus)._M_p;
              if (paVar15 !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)plVar2) {
                operator_delete(plVar2,paVar15->_M_allocated_capacity + 1);
              }
              pbVar14 = (pointer)(paVar15 + 1);
              paVar15 = paVar15 + 2;
            } while (pbVar14 != pbVar5);
            depends.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = pbVar4;
          }
          pbVar5 = commands.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pbVar4 = commands.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (commands.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              commands.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            paVar15 = &(commands.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->field_2;
            do {
              plVar2 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(paVar15 + -1))->_M_dataplus)._M_p;
              if (paVar15 !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)plVar2) {
                operator_delete(plVar2,paVar15->_M_allocated_capacity + 1);
              }
              pbVar14 = (pointer)(paVar15 + 1);
              paVar15 = paVar15 + 2;
            } while (pbVar14 != pbVar5);
            commands.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = pbVar4;
          }
          cmLocalUnixMakefileGenerator3::GetRecursiveMakeCall
                    ((string *)&progressArg,lg,&makefileName,&localName);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands,
                     (string *)&progressArg);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_progressArg != local_1d8) {
            operator_delete(_progressArg,local_1d8[0]._M_allocated_capacity + 1);
          }
          cmLocalUnixMakefileGenerator3::WriteMakeRule
                    (lg,ruleFileStream,"Pre-install relink rule for target.",&localName,&depends,
                     &commands,true,false);
          bVar7 = cmGlobalGenerator::IsExcluded((cmGlobalGenerator *)local_308,gtarget);
          pbVar5 = depends.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pbVar4 = depends.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (!bVar7) {
            if (depends.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                depends.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              paVar15 = &(depends.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->field_2;
              do {
                plVar2 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)(paVar15 + -1))->_M_dataplus)._M_p;
                if (paVar15 !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)plVar2) {
                  operator_delete(plVar2,paVar15->_M_allocated_capacity + 1);
                }
                pbVar14 = (pointer)(paVar15 + 1);
                paVar15 = paVar15 + 2;
              } while (pbVar14 != pbVar5);
              depends.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = pbVar4;
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&depends,&localName);
            pbVar5 = commands.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            pbVar4 = commands.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if (commands.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                commands.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              paVar15 = &(commands.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->field_2;
              do {
                plVar2 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)(paVar15 + -1))->_M_dataplus)._M_p;
                if (paVar15 !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)plVar2) {
                  operator_delete(plVar2,paVar15->_M_allocated_capacity + 1);
                }
                pbVar14 = (pointer)(paVar15 + 1);
                paVar15 = paVar15 + 2;
              } while (pbVar14 != pbVar5);
              commands.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = pbVar4;
            }
            _progressArg = (pointer)local_1d8;
            std::__cxx11::string::_M_construct<char_const*>((string *)&progressArg,"preinstall","");
            cmLocalUnixMakefileGenerator3::WriteMakeRule
                      (lg,ruleFileStream,"Prepare target for install.",(string *)&progressArg,
                       &depends,&commands,true,false);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_progressArg != local_1d8) {
              operator_delete(_progressArg,local_1d8[0]._M_allocated_capacity + 1);
            }
          }
        }
        cmLocalUnixMakefileGenerator3::GetRelativeTargetDirectory_abi_cxx11_
                  ((string *)&progressArg,lg,gtarget);
        std::__cxx11::string::operator=((string *)&localName,(string *)&progressArg);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_progressArg != local_1d8) {
          operator_delete(_progressArg,local_1d8[0]._M_allocated_capacity + 1);
        }
        std::__cxx11::string::_M_assign((string *)&makeTargetName);
        std::__cxx11::string::append((char *)&makeTargetName);
        pbVar5 = depends.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pbVar4 = depends.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (depends.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            depends.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          paVar15 = &(depends.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->field_2;
          do {
            plVar2 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (paVar15 + -1))->_M_dataplus)._M_p;
            if (paVar15 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)plVar2) {
              operator_delete(plVar2,paVar15->_M_allocated_capacity + 1);
            }
            pbVar14 = (pointer)(paVar15 + 1);
            paVar15 = paVar15 + 2;
          } while (pbVar14 != pbVar5);
          depends.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = pbVar4;
        }
        pbVar5 = commands.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pbVar4 = commands.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (commands.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            commands.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          paVar15 = &(commands.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->field_2;
          do {
            plVar2 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (paVar15 + -1))->_M_dataplus)._M_p;
            if (paVar15 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)plVar2) {
              operator_delete(plVar2,paVar15->_M_allocated_capacity + 1);
            }
            pbVar14 = (pointer)(paVar15 + 1);
            paVar15 = paVar15 + 2;
          } while (pbVar14 != pbVar5);
          commands.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = pbVar4;
        }
        cmLocalUnixMakefileGenerator3::GetRecursiveMakeCall
                  ((string *)&progressArg,lg,&makefileName,&makeTargetName);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands,
                   (string *)&progressArg);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_progressArg != local_1d8) {
          operator_delete(_progressArg,local_1d8[0]._M_allocated_capacity + 1);
        }
        cmLocalUnixMakefileGenerator3::WriteMakeRule
                  (lg,ruleFileStream,"clean rule for target.",&makeTargetName,&depends,&commands,
                   true,false);
        pbVar5 = commands.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pbVar4 = commands.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (commands.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            commands.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          paVar15 = &(commands.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->field_2;
          do {
            plVar2 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (paVar15 + -1))->_M_dataplus)._M_p;
            if (paVar15 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)plVar2) {
              operator_delete(plVar2,paVar15->_M_allocated_capacity + 1);
            }
            pbVar14 = (pointer)(paVar15 + 1);
            paVar15 = paVar15 + 2;
          } while (pbVar14 != pbVar5);
          commands.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = pbVar4;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&depends,&makeTargetName);
        _progressArg = (pointer)local_1d8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&progressArg,"clean","");
        cmLocalUnixMakefileGenerator3::WriteMakeRule
                  (lg,ruleFileStream,"clean rule for target.",(string *)&progressArg,&depends,
                   &commands,true,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_progressArg != local_1d8) {
          operator_delete(_progressArg,local_1d8[0]._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)tmp._M_dataplus._M_p != &tmp.field_2) {
          operator_delete(tmp._M_dataplus._M_p,tmp.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)progress.Arg._M_dataplus._M_p != &progress.Arg.field_2) {
          operator_delete(progress.Arg._M_dataplus._M_p,
                          CONCAT71(progress.Arg.field_2._M_allocated_capacity._1_7_,
                                   progress.Arg.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)progress.Dir._M_dataplus._M_p != &progress.Dir.field_2) {
          operator_delete(progress.Dir._M_dataplus._M_p,
                          CONCAT71(progress.Dir.field_2._M_allocated_capacity._1_7_,
                                   progress.Dir.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)makefileName._M_dataplus._M_p != &makefileName.field_2) {
          operator_delete(makefileName._M_dataplus._M_p,
                          CONCAT71(makefileName.field_2._M_allocated_capacity._1_7_,
                                   makefileName.field_2._M_local_buf[0]) + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name._M_dataplus._M_p != &name.field_2) {
        operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
      }
      ppcVar13 = local_58 + 1;
    } while (ppcVar13 != local_60);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)makeTargetName._M_dataplus._M_p != &makeTargetName.field_2) {
    operator_delete(makeTargetName._M_dataplus._M_p,
                    CONCAT71(makeTargetName.field_2._M_allocated_capacity._1_7_,
                             makeTargetName.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)localName._M_dataplus._M_p != &localName.field_2) {
    operator_delete(localName._M_dataplus._M_p,
                    CONCAT71(localName.field_2._M_allocated_capacity._1_7_,
                             localName.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&commands);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&depends);
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::WriteConvenienceRules2(
  std::ostream& ruleFileStream, cmLocalUnixMakefileGenerator3* lg)
{
  std::vector<std::string> depends;
  std::vector<std::string> commands;
  std::string localName;
  std::string makeTargetName;

  // write the directory level rules for this local gen
  this->WriteDirectoryRules2(ruleFileStream, lg);

  bool regenerate = !this->GlobalSettingIsOn("CMAKE_SUPPRESS_REGENERATION");
  if (regenerate) {
    depends.emplace_back("cmake_check_build_system");
  }

  // for each target Generate the rule files for each target.
  const std::vector<cmGeneratorTarget*>& targets = lg->GetGeneratorTargets();
  for (cmGeneratorTarget* gtarget : targets) {
    int type = gtarget->GetType();
    std::string name = gtarget->GetName();
    if (!name.empty() &&
        ((type == cmStateEnums::EXECUTABLE) ||
         (type == cmStateEnums::STATIC_LIBRARY) ||
         (type == cmStateEnums::SHARED_LIBRARY) ||
         (type == cmStateEnums::MODULE_LIBRARY) ||
         (type == cmStateEnums::OBJECT_LIBRARY) ||
         (type == cmStateEnums::UTILITY))) {
      std::string makefileName;
      // Add a rule to build the target by name.
      localName = lg->GetRelativeTargetDirectory(gtarget);
      makefileName = localName;
      makefileName += "/build.make";

      lg->WriteDivider(ruleFileStream);
      ruleFileStream << "# Target rules for target " << localName << "\n\n";

      commands.clear();
      makeTargetName = localName;
      makeTargetName += "/depend";
      commands.push_back(
        lg->GetRecursiveMakeCall(makefileName, makeTargetName));

      makeTargetName = localName;
      makeTargetName += "/build";
      commands.push_back(
        lg->GetRecursiveMakeCall(makefileName, makeTargetName));

      // Write the rule.
      localName += "/all";
      depends.clear();

      cmLocalUnixMakefileGenerator3::EchoProgress progress;
      progress.Dir = lg->GetBinaryDirectory();
      progress.Dir += "/CMakeFiles";
      {
        std::ostringstream progressArg;
        const char* sep = "";
        std::vector<unsigned long> const& progFiles =
          this->ProgressMap[gtarget].Marks;
        for (unsigned long progFile : progFiles) {
          progressArg << sep << progFile;
          sep = ",";
        }
        progress.Arg = progressArg.str();
      }

      bool targetMessages = true;
      if (const char* tgtMsg =
            this->GetCMakeInstance()->GetState()->GetGlobalProperty(
              "TARGET_MESSAGES")) {
        targetMessages = cmSystemTools::IsOn(tgtMsg);
      }

      if (targetMessages) {
        lg->AppendEcho(commands, "Built target " + name,
                       cmLocalUnixMakefileGenerator3::EchoNormal, &progress);
      }

      this->AppendGlobalTargetDepends(depends, gtarget);
      lg->WriteMakeRule(ruleFileStream, "All Build rule for target.",
                        localName, depends, commands, true);

      // add the all/all dependency
      if (!this->IsExcluded(gtarget)) {
        depends.clear();
        depends.push_back(localName);
        commands.clear();
        lg->WriteMakeRule(ruleFileStream, "Include target in all.", "all",
                          depends, commands, true);
      }

      // Write the rule.
      commands.clear();

      {
        // TODO: Convert the total progress count to a make variable.
        std::ostringstream progCmd;
        progCmd << "$(CMAKE_COMMAND) -E cmake_progress_start ";
        // # in target
        progCmd << lg->ConvertToOutputFormat(
          cmSystemTools::CollapseFullPath(progress.Dir),
          cmOutputConverter::SHELL);
        //
        std::set<cmGeneratorTarget const*> emitted;
        progCmd << " " << this->CountProgressMarksInTarget(gtarget, emitted);
        commands.push_back(progCmd.str());
      }
      std::string tmp = "CMakeFiles/";
      tmp += "Makefile2";
      commands.push_back(lg->GetRecursiveMakeCall(tmp, localName));
      {
        std::ostringstream progCmd;
        progCmd << "$(CMAKE_COMMAND) -E cmake_progress_start "; // # 0
        progCmd << lg->ConvertToOutputFormat(
          cmSystemTools::CollapseFullPath(progress.Dir),
          cmOutputConverter::SHELL);
        progCmd << " 0";
        commands.push_back(progCmd.str());
      }
      depends.clear();
      if (regenerate) {
        depends.emplace_back("cmake_check_build_system");
      }
      localName = lg->GetRelativeTargetDirectory(gtarget);
      localName += "/rule";
      lg->WriteMakeRule(ruleFileStream,
                        "Build rule for subdir invocation for target.",
                        localName, depends, commands, true);

      // Add a target with the canonical name (no prefix, suffix or path).
      commands.clear();
      depends.clear();
      depends.push_back(localName);
      lg->WriteMakeRule(ruleFileStream, "Convenience name for target.", name,
                        depends, commands, true);

      // Add rules to prepare the target for installation.
      if (gtarget->NeedRelinkBeforeInstall(lg->GetConfigName())) {
        localName = lg->GetRelativeTargetDirectory(gtarget);
        localName += "/preinstall";
        depends.clear();
        commands.clear();
        commands.push_back(lg->GetRecursiveMakeCall(makefileName, localName));
        lg->WriteMakeRule(ruleFileStream,
                          "Pre-install relink rule for target.", localName,
                          depends, commands, true);

        if (!this->IsExcluded(gtarget)) {
          depends.clear();
          depends.push_back(localName);
          commands.clear();
          lg->WriteMakeRule(ruleFileStream, "Prepare target for install.",
                            "preinstall", depends, commands, true);
        }
      }

      // add the clean rule
      localName = lg->GetRelativeTargetDirectory(gtarget);
      makeTargetName = localName;
      makeTargetName += "/clean";
      depends.clear();
      commands.clear();
      commands.push_back(
        lg->GetRecursiveMakeCall(makefileName, makeTargetName));
      lg->WriteMakeRule(ruleFileStream, "clean rule for target.",
                        makeTargetName, depends, commands, true);
      commands.clear();
      depends.push_back(makeTargetName);
      lg->WriteMakeRule(ruleFileStream, "clean rule for target.", "clean",
                        depends, commands, true);
    }
  }
}